

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O1

void __thiscall hwnet::TCPSocket::~TCPSocket(TCPSocket *this)

{
  ~TCPSocket((TCPSocket *)&this[-1].lastSendTime);
  operator_delete(&this[-1].lastSendTime,0xb08);
  return;
}

Assistant:

TCPSocket::~TCPSocket() {
	if(auto sp = this->timer.lock()) {
		sp->cancel();
	}
	::close(this->fd);

#ifdef USE_SSL
	if(this->ssl) {
		SSL_free(this->ssl);
	}
#endif

}